

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

int Cnf_IsopWriteCube(int Cube,int nVars,int *pVars,int *pLiterals)

{
  int nLits;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  if (0 < nVars) {
    uVar1 = (ulong)(uint)nVars;
    uVar2 = 0;
    do {
      if ((Cube & 3U) == 2) {
        iVar3 = pVars[uVar2] * 2 + 1;
LAB_0050388f:
        *pLiterals = iVar3;
        pLiterals = pLiterals + 1;
      }
      else {
        if ((Cube & 3U) == 1) {
          iVar3 = pVars[uVar2] * 2;
          goto LAB_0050388f;
        }
        nVars = nVars + -1;
      }
      Cube = Cube >> 2;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return nVars;
}

Assistant:

int Cnf_IsopWriteCube( int Cube, int nVars, int * pVars, int * pLiterals )
{
    int nLits = nVars, b;
    for ( b = 0; b < nVars; b++ )
    {
        if ( (Cube & 3) == 1 ) // value 0 --> write positive literal
            *pLiterals++ = 2 * pVars[b];
        else if ( (Cube & 3) == 2 ) // value 1 --> write negative literal
            *pLiterals++ = 2 * pVars[b] + 1;
        else
            nLits--;
        Cube >>= 2;
    }
    return nLits;
}